

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O2

void __thiscall ezexample::mini_setup_example(ezexample *this)

{
  size_t *psVar1;
  char cVar2;
  char cVar3;
  example *peVar4;
  char *pcVar5;
  pointer pbVar6;
  size_t sVar7;
  float fVar8;
  
  this->ec->partial_prediction = 0.0;
  fVar8 = (*(this->vw_par_ref->p->lp).get_weight)(&this->ec->l);
  this->ec->weight = fVar8;
  psVar1 = &this->ec->num_features;
  *psVar1 = *psVar1 - this->quadratic_features_num;
  this->ec->total_sum_feat_sq = this->ec->total_sum_feat_sq - this->quadratic_features_sqr;
  this->quadratic_features_num = 0;
  this->quadratic_features_sqr = 0.0;
  peVar4 = this->ec;
  fVar8 = 0.0;
  sVar7 = 0;
  for (pbVar6 = (this->vw_ref->pairs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 != (this->vw_ref->pairs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    pcVar5 = (pbVar6->_M_dataplus)._M_p;
    cVar2 = *pcVar5;
    cVar3 = pcVar5[1];
    sVar7 = sVar7 + ((long)(peVar4->super_example_predict).feature_space[cVar3].values._end -
                     (long)(peVar4->super_example_predict).feature_space[cVar3].values._begin >> 2)
                    * ((long)(peVar4->super_example_predict).feature_space[cVar2].values._end -
                       (long)(peVar4->super_example_predict).feature_space[cVar2].values._begin >> 2
                      );
    this->quadratic_features_num = sVar7;
    pcVar5 = (pbVar6->_M_dataplus)._M_p;
    fVar8 = fVar8 + (peVar4->super_example_predict).feature_space[*pcVar5].sum_feat_sq *
                    (peVar4->super_example_predict).feature_space[pcVar5[1]].sum_feat_sq;
    this->quadratic_features_sqr = fVar8;
  }
  peVar4->num_features = peVar4->num_features + sVar7;
  this->ec->total_sum_feat_sq = this->quadratic_features_sqr + this->ec->total_sum_feat_sq;
  return;
}

Assistant:

void mini_setup_example()
  {
    ec->partial_prediction = 0.;
    ec->weight = vw_par_ref->p->lp.get_weight(&ec->l);

    ec->num_features -= quadratic_features_num;
    ec->total_sum_feat_sq -= quadratic_features_sqr;

    quadratic_features_num = 0;
    quadratic_features_sqr = 0.;

    for (std::vector<std::string>::iterator i = vw_ref->pairs.begin(); i != vw_ref->pairs.end(); i++)
    {
      quadratic_features_num += ec->feature_space[(int)(*i)[0]].size() * ec->feature_space[(int)(*i)[1]].size();
      quadratic_features_sqr +=
          ec->feature_space[(int)(*i)[0]].sum_feat_sq * ec->feature_space[(int)(*i)[1]].sum_feat_sq;
    }
    ec->num_features += quadratic_features_num;
    ec->total_sum_feat_sq += quadratic_features_sqr;
  }